

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O0

void send_sysex(void)

{
  int iVar1;
  size_t sVar2;
  uint local_78;
  int i;
  PmEvent msg;
  int shift;
  int data;
  PortMidiStream *midi;
  FILE *f;
  char line [80];
  
  msg.message = 0;
  iVar1 = get_number("Type output device number: ");
  do {
    latency = get_number(
                        "Latency in milliseconds (0 to send data immediatedly,\n  >0 to send timestamped messages): "
                        );
  } while (latency < 0);
  i = 0;
  Pm_OpenOutput((PortMidiStream **)&shift,iVar1,(void *)0x0,0,(PmTimeProcPtr)0x0,(void *)0x0,latency
               );
  printf("Midi Output opened, type file with sysex data: ");
  fgets((char *)&f,0x50,_stdin);
  sVar2 = strlen((char *)&f);
  if (sVar2 != 0) {
    sVar2 = strlen((char *)&f);
    *(undefined1 *)((long)&midi + sVar2 + 7) = 0;
  }
  midi = fopen((char *)&f,"r");
  if ((FILE *)midi == (FILE *)0x0) {
    printf("Could not open %s\n",&f);
    Pm_Close(_shift);
  }
  else {
    local_78 = 0;
    do {
      iVar1 = __isoc99_fscanf(midi,"%x",&msg.timestamp);
      if (iVar1 == 1) {
        local_78 = msg.timestamp << ((byte)msg.message & 0x1f) | local_78;
        msg.message = msg.message + 8;
      }
      if ((msg.message == 0x20) || (msg.timestamp == 0xf7)) {
        Pm_Write(_shift,(PmEvent *)&stack0xffffffffffffff88,1);
        local_78 = 0;
        msg.message = 0;
      }
    } while (msg.timestamp != 0xf7);
    fclose((FILE *)midi);
    Pm_Close(_shift);
  }
  return;
}

Assistant:

void send_sysex()
{
    char line[80];
    FILE *f;
    PmStream *midi;
    int data;
    int shift = 0;
    PmEvent msg;

	/* determine which output device to use */
    int i = get_number("Type output device number: ");
    while ((latency = get_number(
                     "Latency in milliseconds (0 to send data immediatedly,\n"
                     "  >0 to send timestamped messages): ")) < 0);

    msg.timestamp = 0; /* no need for timestamp */

	/* open output device */
    Pm_OpenOutput(&midi, i, NULL, 0, NULL, NULL, latency);
	printf("Midi Output opened, type file with sysex data: ");

    /* open file */
    fgets(line, STRING_MAX, stdin);
    /* remove the newline character */
    if (strlen(line) > 0) line[strlen(line) - 1] = 0;
    f = fopen(line, "r");
    if (!f) {
        printf("Could not open %s\n", line);
        Pm_Close(midi);
        return;
    }

    /* read file and send data */
    msg.message = 0;
    while (1) {
        /* get next byte from file */

        if (fscanf(f, "%x", &data) == 1) {
            /* printf("read %x, ", data); */
            /* OR byte into message at proper offset */
            msg.message |= (data << shift);
            shift += 8;
        }
        /* send the message if it's full (shift == 32) or if we are at end */
        if (shift == 32 || data == MIDI_EOX) {
            /* this will send sysex data 4 bytes at a time -- it would
               be much more efficient to send multiple PmEvents at once
               but this method is simpler. See Pm_WriteSysEx for a more
               efficient code example.
             */
            Pm_Write(midi, &msg, 1);
            msg.message = 0;
            shift = 0;
        }
        if (data == MIDI_EOX) { /* end of message */
            fclose(f);
            Pm_Close(midi);
            return;
        }
    }
}